

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlign_IsAligned_Test::~ArenaAlign_IsAligned_Test
          (ArenaAlign_IsAligned_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaAlign, IsAligned) {
  auto align_64 = ArenaAlignAs(64);
  EXPECT_TRUE(align_64.IsAligned(0));
  EXPECT_FALSE(align_64.IsAligned(1));
  EXPECT_FALSE(align_64.IsAligned(63));
  EXPECT_TRUE(align_64.IsAligned(64));
  EXPECT_FALSE(align_64.IsAligned(65));
  EXPECT_FALSE(align_64.IsAligned(127));
  EXPECT_TRUE(align_64.IsAligned(128));
}